

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O3

Metric * __thiscall hta::Directory::operator[](Directory *this,string *name)

{
  pointer ppVar1;
  size_t __n;
  pointer pcVar2;
  unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_> uVar3;
  int iVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
  _Var5;
  pointer ppVar6;
  bool bVar7;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
  pVar8;
  Metric metric;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Metric local_88;
  
  OptionalMutex::lock(&this->mutex_);
  _Var5._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->metrics_)._M_h,name);
  if (_Var5._M_cur != (__node_type *)0x0) {
LAB_0016fca9:
    if ((this->mutex_).mutex_.super__Optional_base<std::mutex,_false,_false>._M_payload.
        super__Optional_payload_base<std::mutex>._M_engaged == true) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    }
    return (Metric *)
           ((long)&((_Var5._M_cur)->
                   super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
                   ).
                   super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>
                   ._M_storage._M_storage + 0x20);
  }
  ppVar6 = (this->prefixes_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->prefixes_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    do {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)name);
      uVar3._M_t.
      super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>._M_t.
      super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>.
      super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl =
           local_88.storage_metric_._M_t.
           super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
           _M_t.
           super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
           .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
      __n = (ppVar6->first)._M_string_length;
      if (__n == local_88.interval_min_.__r) {
        if (__n == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp((ppVar6->first)._M_dataplus._M_p,
                       (void *)local_88.storage_metric_._M_t.
                               super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
                               .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl,
                       __n);
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (uVar3._M_t.
          super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>.
          _M_t.
          super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
          .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl !=
          (__uniq_ptr_data<hta::storage::Metric,_std::default_delete<hta::storage::Metric>,_true,_true>
           )&local_88.interval_max_) {
        operator_delete((void *)uVar3._M_t.
                                super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
                                .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl,
                        local_88.interval_max_.__r + 1);
      }
      if (bVar7) {
        make_metric(&local_88,this,name,&ppVar6->second);
        pVar8 = std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_M_emplace<std::__cxx11::string_const&,hta::Metric>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&this->metrics_,name,&local_88);
        _Var5._M_cur = (__node_type *)
                       pVar8.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
                       ._M_cur;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("it.second",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/directory.cpp"
                        ,0xa5,"Metric &hta::Directory::operator[](const std::string &)");
        }
        Metric::~Metric(&local_88);
        goto LAB_0016fca9;
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar1);
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  pcVar2 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + name->_M_string_length);
  throw_exception<hta::MissingMetricConfig,char_const*,std::__cxx11::string>
            ("no settings found to create metric ",&local_a8);
}

Assistant:

Metric& Directory::operator[](const std::string& name)
{
    std::lock_guard<OptionalMutex> guard(mutex_);
    if (auto it = metrics_.find(name); it != metrics_.end())
    {
        return it->second;
    }
    for (const auto& elem : prefixes_)
    {
        const auto& prefix = elem.first;
        if (prefix == name.substr(0, prefix.size()))
        {
            Metric metric = make_metric(name, elem.second);
            {
                auto it = metrics_.emplace(name, std::move(metric));
                assert(it.second);
                return it.first->second;
            }
        }
    }
    throw_exception<MissingMetricConfig>("no settings found to create metric ", name);
}